

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_memio.h
# Opt level: O0

bool __thiscall Kumu::MemIOReader::ReadUi8(MemIOReader *this,ui8_t *i)

{
  bool bVar1;
  ui8_t *i_local;
  MemIOReader *this_local;
  
  if (i == (ui8_t *)0x0) {
    __assert_fail("i",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_memio.h"
                  ,0xb0,"bool Kumu::MemIOReader::ReadUi8(ui8_t *)");
  }
  bVar1 = this->m_size + 1 <= this->m_capacity;
  if (bVar1) {
    *i = this->m_p[this->m_size];
    this->m_size = this->m_size + 1;
  }
  return bVar1;
}

Assistant:

inline bool ReadUi8(ui8_t* i) {
	assert(i);
	if ( ( m_size + 1 ) > m_capacity )
	  return false;

	*i = *(m_p + m_size);
	m_size++;
	return true;
      }